

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::ListSliceFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  scalar_function_t *psVar1;
  LogicalType varargs;
  _Any_data *p_Var2;
  long lVar3;
  undefined8 *puVar4;
  ScalarFunctionSet *in_RDI;
  bind_scalar_function_t *pp_Var5;
  byte bVar6;
  initializer_list<duckdb::LogicalType> __l;
  ScalarFunctionSet *set;
  ScalarFunction fun;
  undefined4 in_stack_fffffffffffffac4;
  undefined4 in_stack_fffffffffffffacc;
  FunctionNullHandling in_stack_fffffffffffffad8;
  bind_lambda_function_t in_stack_fffffffffffffae0;
  scalar_function_t local_510;
  _Any_data *local_4f0;
  LogicalType local_4e8;
  vector<duckdb::LogicalType,_true> local_4d0;
  LogicalType local_4b8 [4];
  undefined1 local_458 [144];
  LogicalType LStack_3c8;
  FunctionStability local_3b0;
  FunctionNullHandling FStack_3af;
  FunctionErrors FStack_3ae;
  FunctionCollationHandling FStack_3ad;
  _Any_data _Stack_3a8;
  _Manager_type local_398;
  undefined8 auStack_388 [9];
  element_type *local_340;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_338;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  bVar6 = 0;
  LogicalType::LogicalType(local_4b8,ANY);
  LogicalType::LogicalType(local_4b8 + 1,ANY);
  LogicalType::LogicalType(local_4b8 + 2,ANY);
  __l._M_len = 3;
  __l._M_array = local_4b8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_4d0,__l,
             (allocator_type *)&stack0xfffffffffffffae7);
  LogicalType::LogicalType(&local_4e8,ANY);
  local_510.super__Function_base._M_functor._8_8_ = 0;
  local_510.super__Function_base._M_functor._M_unused._M_object = ArraySliceFunction;
  local_510._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_510.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(local_4b8 + 3,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = local_4b8 + 3;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffac4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffacc;
  ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_458,&local_4d0,&local_4e8,&local_510,ArraySliceBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffad8,in_stack_fffffffffffffae0);
  LogicalType::~LogicalType(local_4b8 + 3);
  if (local_510.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_510.super__Function_base._M_manager)
              ((_Any_data *)&local_510,(_Any_data *)&local_510,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_4e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_4d0);
  lVar3 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_4b8[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  FStack_3af = SPECIAL_HANDLING;
  BaseScalarFunction::SetReturnsError(&local_e0,(BaseScalarFunction *)local_458);
  BaseScalarFunction::~BaseScalarFunction(&local_e0);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_330,(SimpleFunction *)local_458);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02446ee0;
  LogicalType::LogicalType(&local_330.super_BaseScalarFunction.return_type,&LStack_3c8);
  local_330.super_BaseScalarFunction.stability = local_3b0;
  local_330.super_BaseScalarFunction.null_handling = FStack_3af;
  local_330.super_BaseScalarFunction.errors = FStack_3ae;
  local_330.super_BaseScalarFunction.collation_handling = FStack_3ad;
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0243add0;
  psVar1 = &local_330.function;
  local_4f0 = &_Stack_3a8;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)local_4f0);
  puVar4 = auStack_388;
  pp_Var5 = &local_330.bind;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pp_Var5 = (bind_scalar_function_t)*puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    pp_Var5 = pp_Var5 + (ulong)bVar6 * -2 + 1;
  }
  local_330.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_340;
  local_330.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_338._M_pi;
  if (local_338._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_338._M_pi)->_M_use_count = (local_338._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_338._M_pi)->_M_use_count = (local_338._M_pi)->_M_use_count + 1;
    }
  }
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0243add0;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  LogicalType::LogicalType(local_4b8,BIGINT);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_458 + 0x48)
             ,local_4b8);
  LogicalType::~LogicalType(local_4b8);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_208,(SimpleFunction *)local_458);
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02446ee0;
  LogicalType::LogicalType(&local_208.super_BaseScalarFunction.return_type,&LStack_3c8);
  p_Var2 = local_4f0;
  psVar1 = &local_208.function;
  local_208.super_BaseScalarFunction.stability = local_3b0;
  local_208.super_BaseScalarFunction.null_handling = FStack_3af;
  local_208.super_BaseScalarFunction.errors = FStack_3ae;
  local_208.super_BaseScalarFunction.collation_handling = FStack_3ad;
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0243add0;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)local_4f0);
  puVar4 = auStack_388;
  pp_Var5 = &local_208.bind;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pp_Var5 = (bind_scalar_function_t)*puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    pp_Var5 = pp_Var5 + (ulong)bVar6 * -2 + 1;
  }
  local_208.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_340;
  local_208.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_338._M_pi;
  if (local_338._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_338._M_pi)->_M_use_count = (local_338._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_338._M_pi)->_M_use_count = (local_338._M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_208);
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0243add0;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  local_458._0_8_ = &PTR__ScalarFunction_0243add0;
  if (local_338._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_338._M_pi);
  }
  if (local_398 != (_Manager_type)0x0) {
    (*local_398)(p_Var2,p_Var2,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_458);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ListSliceFun::GetFunctions() {
	// the arguments and return types are actually set in the binder function
	ScalarFunction fun({LogicalType::ANY, LogicalType::ANY, LogicalType::ANY}, LogicalType::ANY, ArraySliceFunction,
	                   ArraySliceBind);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	BaseScalarFunction::SetReturnsError(fun);
	ScalarFunctionSet set;
	set.AddFunction(fun);
	fun.arguments.push_back(LogicalType::BIGINT);
	set.AddFunction(fun);
	return set;
}